

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_splitter.hpp
# Opt level: O2

void pstore::dump::
     expand_tabs<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               out,size_t tab_size)

{
  undefined8 in_RAX;
  unsigned_long __n;
  size_t position;
  ulong uVar1;
  undefined8 uStack_38;
  
  uVar1 = 0;
  uStack_38 = in_RAX;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    if (*first._M_current == '\t') {
      __n = tab_size - uVar1 % tab_size;
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      out.container =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__fill_n_a1<std::back_insert_iterator<std::__cxx11::string>,unsigned_long,char>
                     (out,__n,(char *)((long)&uStack_38 + 7));
      uVar1 = uVar1 + __n;
    }
    else {
      std::__cxx11::string::push_back((char)out.container);
      uVar1 = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void expand_tabs (InputIterator first, InputIterator last, OutputIterator out,
                          std::size_t const tab_size = 4) {
            auto position = std::size_t{0};
            for (; first != last; ++first) {
                auto const c = *first;
                if (c != '\t') {
                    *(out++) = c;
                    ++position;
                } else {
                    auto const spaces = tab_size - (position % tab_size);
                    out = std::fill_n (out, spaces, ' ');
                    position += spaces;
                }
            }
        }